

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::EventLog::RecordJsRTConstructCall
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var funcVar,uint32 argCount,
          Var *args)

{
  EventLogEntry *actionEvent;
  void **ppvVar1;
  JsRTConstructCallAction *local_48;
  JsRTConstructCallAction *ccAction;
  Var *local_38;
  
  local_48 = (JsRTConstructCallAction *)0x0;
  ccAction = (JsRTConstructCallAction *)actionPopper;
  local_38 = args;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                          (this,&local_48);
  local_48->ArgCount = argCount + 1;
  ppvVar1 = SlabAllocatorBase<8>::SlabAllocateArray<void*>
                      (&this->m_eventSlabAllocator,(ulong)(argCount + 1));
  local_48->ArgArray = ppvVar1;
  *ppvVar1 = funcVar;
  js_memcpy_s(local_48->ArgArray + 1,(ulong)(local_48->ArgCount - 1) << 3,local_38,
              (ulong)argCount << 3);
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            ((TTDJsRTActionResultAutoRecorder *)ccAction,actionEvent,&local_48->Result);
  return;
}

Assistant:

void EventLog::RecordJsRTConstructCall(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var funcVar, uint32 argCount, Js::Var* args)
    {
        NSLogEvents::JsRTConstructCallAction* ccAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTConstructCallAction, NSLogEvents::EventKind::ConstructCallActionTag>(&ccAction);

        ccAction->ArgCount = argCount + 1;

        static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

        ccAction->ArgArray = this->m_eventSlabAllocator.SlabAllocateArray<TTDVar>(ccAction->ArgCount);
        ccAction->ArgArray[0] = TTD_CONVERT_JSVAR_TO_TTDVAR(funcVar);
        js_memcpy_s(ccAction->ArgArray + 1, (ccAction->ArgCount - 1) * sizeof(TTDVar), args, argCount * sizeof(Js::Var));

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(ccAction->Result));
    }